

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcCrossProducts
          (BeagleCPUImpl<double,_1,_0> *this,int *postBufferIndices,int *preBufferIndices,
          int *categoryRatesIndices,int *categoryWeightsIndices,double *edgeLengths,int count,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  void *ptr;
  double *local_38;
  
  pdVar1 = this->gCategoryRates[*categoryRatesIndices];
  pdVar2 = this->gCategoryWeights[*categoryWeightsIndices];
  if (this->crossProductNumeratorTmp == (double *)0x0) {
    local_38 = (double *)0x0;
    posix_memalign(&local_38,0x20,
                   (long)this->kPaddedPatternCount * (long)this->kStateCount *
                   (long)this->kStateCount * 8);
    this->crossProductNumeratorTmp = local_38;
  }
  if (0 < count) {
    uVar4 = 0;
    do {
      pdVar3 = this->gPartials[preBufferIndices[uVar4]];
      if (this->gTipStates[postBufferIndices[uVar4]] == (int *)0x0) {
        (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x3b])
                  (this,this->gPartials[postBufferIndices[uVar4]],pdVar3,pdVar1,pdVar2,
                   outSumDerivatives,outSumSquaredDerivatives);
      }
      else {
        (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x3a])
                  (edgeLengths[uVar4],this,this->gTipStates[postBufferIndices[uVar4]],pdVar3,pdVar1,
                   pdVar2,outSumDerivatives,outSumSquaredDerivatives);
      }
      uVar4 = uVar4 + 1;
    } while ((uint)count != uVar4);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProducts(const int *postBufferIndices,
                                                         const int *preBufferIndices,
                                                         const int *categoryRatesIndices,
                                                         const int *categoryWeightsIndices,
                                                         const double *edgeLengths,
                                                         int count,
                                                         double *outSumDerivatives,
                                                         double *outSumSquaredDerivatives) {

    int returnCode = BEAGLE_SUCCESS;

    const int secondDerivativeIndex = BEAGLE_OP_NONE;
    const double *categoryRates = gCategoryRates[categoryRatesIndices[0]]; // TODO Generalize
    const REALTYPE *categoryWeights = gCategoryWeights[categoryWeightsIndices[0]]; // TODO Generalize

    if (crossProductNumeratorTmp == nullptr) {
        crossProductNumeratorTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount
                * kStateCount * kStateCount);
    }

//    std::fill(outCrossProducts, outCrossProducts + kStateCount * kStateCount, 0.0); // TODO Remove

    for (int nodeNum = 0; nodeNum < count; nodeNum++) {

        const double edgeLength = edgeLengths[nodeNum];

        const REALTYPE *preOrderPartial = gPartials[preBufferIndices[nodeNum]];
        const int *tipStates = gTipStates[postBufferIndices[nodeNum]];

//        const int firstDerivativeIndex = firstDerivativeIndices[nodeNum];
        const int scalingFactorsIndex = -1; // cumulativeScaleIndices[nodeNum];

        const int patternOffset = nodeNum * kPatternCount;
//        double* outDerivativesForNode = (outDerivatives == NULL) ?
//                NULL : outDerivatives + patternOffset;
//        double* outSumDerivativesForNode = (outSumDerivatives == NULL) ?
//                NULL : outSumDerivatives + nodeNum;
//        double* outSumSquaredDerivativesForNode = (outSumSquaredDerivatives == NULL) ?
//                NULL : outSumSquaredDerivatives + nodeNum;
//
//        resetDerivativeTemporaries();
//
        if (tipStates != NULL) {

            calcCrossProductsStates(tipStates, preOrderPartial,
                                    categoryRates,
                                    categoryWeights,
                                    edgeLength,
                                    outSumDerivatives,
                                    outSumSquaredDerivatives);

        } else {

            const REALTYPE *postOrderPartial = gPartials[postBufferIndices[nodeNum]];
            calcCrossProductsPartials(postOrderPartial, preOrderPartial,
                                      categoryRates,
                                      categoryWeights,
                                      edgeLength,
                                      outSumDerivatives,
                                      outSumSquaredDerivatives);
        }
//
//        accumulateDerivatives(outDerivativesForNode,
//                outSumDerivativesForNode,
//                outSumSquaredDerivativesForNode);

//        std::cout << "A: " << outCrossProducts[0] << std::endl;
//        std::fill(outCrossProducts, outCrossProducts + kStateCount * kStateCount, 0.0); // TODO Remove

    }

    return returnCode;
}